

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

Span<char> __thiscall Potassco::StringBuilder::toSpan(StringBuilder *this)

{
  Buffer x;
  Span<char> local_20;
  
  buffer((Buffer *)&local_20,this);
  return local_20;
}

Assistant:

Span<char> StringBuilder::toSpan() const {
	Buffer x = buffer();
	return Potassco::toSpan(x.head, x.used);
}